

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprModule * Analyze(ExpressionContext *ctx,SynModule *syntax,char *code,char *moduleRoot)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TypeStruct *pTVar5;
  MemberHandle *pMVar6;
  VariableData *pVVar7;
  undefined4 extraout_var_14;
  TypeRef *pTVar8;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ExprModule *pEVar9;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  InplaceStr name_05;
  InplaceStr name_06;
  InplaceStr name_07;
  InplaceStr name_08;
  InplaceStr name_09;
  InplaceStr name_10;
  InplaceStr name_11;
  InplaceStr name_12;
  InplaceStr name_13;
  InplaceStr name_14;
  InplaceStr name_15;
  InplaceStr name_16;
  InplaceStr name_17;
  InplaceStr name_18;
  uint in_stack_ffffffffffffffc0;
  TraceScope traceScope;
  TypeBase *pTVar4;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  
  if (Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::
                                 token);
    if (iVar1 != 0) {
      Analyze::token = NULLC::TraceGetToken("analyze","Analyze");
      __cxa_guard_release(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,Analyze::token);
  if (ctx->globalScope == (ScopeData *)0x0) {
    ctx->code = code;
    sVar3 = strlen(code);
    ctx->codeEnd = code + sVar3;
    ctx->moduleRoot = moduleRoot;
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    ctx->globalScope = ctx->scope;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var,iVar1);
    name.end = "";
    name.begin = "void";
    TypeVoid::TypeVoid((TypeVoid *)pTVar4,name);
    ctx->typeVoid = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_00,iVar1);
    name_00.end = "";
    name_00.begin = "bool";
    TypeBool::TypeBool((TypeBool *)pTVar4,name_00);
    ctx->typeBool = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_01,iVar1);
    name_01.end = "";
    name_01.begin = "char";
    TypeChar::TypeChar((TypeChar *)pTVar4,name_01);
    ctx->typeChar = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_02,iVar1);
    name_02.end = "";
    name_02.begin = "short";
    TypeShort::TypeShort((TypeShort *)pTVar4,name_02);
    ctx->typeShort = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_03,iVar1);
    name_03.end = "";
    name_03.begin = "int";
    TypeInt::TypeInt((TypeInt *)pTVar4,name_03);
    ctx->typeInt = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_04,iVar1);
    name_04.end = "";
    name_04.begin = "long";
    TypeLong::TypeLong((TypeLong *)pTVar4,name_04);
    ctx->typeLong = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_05,iVar1);
    name_05.end = "";
    name_05.begin = "float";
    TypeFloat::TypeFloat((TypeFloat *)pTVar4,name_05);
    ctx->typeFloat = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_06,iVar1);
    name_06.end = "";
    name_06.begin = "double";
    TypeDouble::TypeDouble((TypeDouble *)pTVar4,name_06);
    ctx->typeDouble = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_07,iVar1);
    name_07.end = "";
    name_07.begin = "typeid";
    TypeTypeID::TypeTypeID((TypeTypeID *)pTVar4,name_07);
    ctx->typeTypeID = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_08,iVar1);
    name_08.end = "";
    name_08.begin = "__function";
    TypeFunctionID::TypeFunctionID((TypeFunctionID *)pTVar4,name_08);
    ctx->typeFunctionID = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_09,iVar1);
    name_09.end = "";
    name_09.begin = "__nullptr";
    TypeNullptr::TypeNullptr((TypeNullptr *)pTVar4,name_09);
    ctx->typeNullPtr = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_10,iVar1);
    name_10.end = "";
    name_10.begin = "generic";
    TypeGeneric::TypeGeneric((TypeGeneric *)pTVar4,name_10);
    ctx->typeGeneric = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    pTVar4 = (TypeBase *)CONCAT44(extraout_var_11,iVar1);
    name_11.end = "";
    name_11.begin = "auto";
    TypeAuto::TypeAuto((TypeAuto *)pTVar4,name_11);
    ctx->typeAuto = pTVar4;
    ExpressionContext::AddType(ctx,pTVar4);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x88);
    pTVar5 = (TypeStruct *)CONCAT44(extraout_var_12,iVar1);
    name_12.end = "";
    name_12.begin = "auto ref";
    TypeAutoRef::TypeAutoRef((TypeAutoRef *)pTVar5,name_12);
    ctx->typeAutoRef = pTVar5;
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar5);
    ExpressionContext::PushScope(ctx,&ctx->typeAutoRef->super_TypeBase);
    pTVar5 = ctx->typeAutoRef;
    pTVar5->typeScope = ctx->scope;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar6 = (MemberHandle *)CONCAT44(extraout_var_13,iVar1);
    uVar2 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar2 + 1;
    name_14.end = "";
    name_14.begin = "type";
    pVVar7 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,&syntax->super_SynBase,0,ctx->typeTypeID,name_14,SUB41(uVar2,0),
                        in_stack_ffffffffffffffc0);
    pMVar6->source = &syntax->super_SynBase;
    pMVar6->variable = pVVar7;
    pMVar6->initializer = (SynBase *)0x0;
    pMVar6->next = (MemberHandle *)0x0;
    pMVar6->listed = false;
    IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
    pTVar5 = ctx->typeAutoRef;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar6 = (MemberHandle *)CONCAT44(extraout_var_14,iVar1);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    uVar2 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar2 + 1;
    name_15.end = "";
    name_15.begin = "ptr";
    pVVar7 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,&syntax->super_SynBase,0,&pTVar8->super_TypeBase,name_15,SUB41(uVar2,0),
                        in_stack_ffffffffffffffc0);
    pMVar6->source = &syntax->super_SynBase;
    pMVar6->variable = pVVar7;
    pMVar6->initializer = (SynBase *)0x0;
    pMVar6->next = (MemberHandle *)0x0;
    pMVar6->listed = false;
    IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
    anon_unknown.dwarf_b837c::FinalizeAlignment(ctx->typeAutoRef);
    ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x88);
    pTVar5 = (TypeStruct *)CONCAT44(extraout_var_15,iVar1);
    name_13.end = "";
    name_13.begin = "auto[]";
    TypeAutoArray::TypeAutoArray((TypeAutoArray *)pTVar5,name_13);
    ctx->typeAutoArray = pTVar5;
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar5);
    ExpressionContext::PushScope(ctx,&ctx->typeAutoArray->super_TypeBase);
    pTVar5 = ctx->typeAutoArray;
    pTVar5->typeScope = ctx->scope;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar6 = (MemberHandle *)CONCAT44(extraout_var_16,iVar1);
    uVar2 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar2 + 1;
    name_16.end = "";
    name_16.begin = "type";
    pVVar7 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,&syntax->super_SynBase,0,ctx->typeTypeID,name_16,SUB41(uVar2,0),
                        in_stack_ffffffffffffffc0);
    pMVar6->source = &syntax->super_SynBase;
    pMVar6->variable = pVVar7;
    pMVar6->initializer = (SynBase *)0x0;
    pMVar6->next = (MemberHandle *)0x0;
    pMVar6->listed = false;
    IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
    pTVar5 = ctx->typeAutoArray;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar6 = (MemberHandle *)CONCAT44(extraout_var_17,iVar1);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    uVar2 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar2 + 1;
    name_17.end = "";
    name_17.begin = "ptr";
    pVVar7 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,&syntax->super_SynBase,0,&pTVar8->super_TypeBase,name_17,SUB41(uVar2,0),
                        in_stack_ffffffffffffffc0);
    pMVar6->source = &syntax->super_SynBase;
    pMVar6->variable = pVVar7;
    pMVar6->initializer = (SynBase *)0x0;
    pMVar6->next = (MemberHandle *)0x0;
    pMVar6->listed = false;
    IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
    pTVar5 = ctx->typeAutoArray;
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar6 = (MemberHandle *)CONCAT44(extraout_var_18,iVar1);
    uVar2 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar2 + 1;
    name_18.end = "";
    name_18.begin = "size";
    pVVar7 = anon_unknown.dwarf_b837c::AllocateClassMember
                       (ctx,&syntax->super_SynBase,0,ctx->typeInt,name_18,SUB41(uVar2,0),
                        in_stack_ffffffffffffffc0);
    pMVar6->source = &syntax->super_SynBase;
    pMVar6->variable = pVVar7;
    pMVar6->initializer = (SynBase *)0x0;
    pMVar6->next = (MemberHandle *)0x0;
    pMVar6->listed = false;
    IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
    anon_unknown.dwarf_b837c::FinalizeAlignment(ctx->typeAutoArray);
    ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    uVar2 = *(uint *)(NULLC::traceContext + 0x244);
    iVar1 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
    if (iVar1 == 0) {
      ctx->errorHandlerActive = true;
      if (ctx->memoryLimit != 0) {
        iVar1 = (*ctx->allocator->_vptr_Allocator[4])();
        (*ctx->allocator->_vptr_Allocator[6])
                  (ctx->allocator,(ulong)(iVar1 + ctx->memoryLimit),ctx,
                   anon_unknown.dwarf_b837c::OnMemoryLimitHit);
      }
      pEVar9 = AnalyzeModule(ctx,syntax);
      ctx->errorHandlerActive = false;
      if (ctx->memoryLimit != 0) {
        (*ctx->allocator->_vptr_Allocator[5])();
      }
      uVar2 = NULLCTime::clockMicro();
      (ctx->statistics).startTime = uVar2;
      (ctx->statistics).finishTime = 0;
      if (ctx->scope->type != SCOPE_EXPLICIT) {
        __assert_fail("ctx.scope->type == SCOPE_EXPLICIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x3598,
                      "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                     );
      }
      ctx->scope = ctx->scope->scope;
      uVar2 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"Cleanup",uVar2);
      if (ctx->scope != (ScopeData *)0x0) {
        __assert_fail("ctx.scope == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x359d,
                      "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                     );
      }
    }
    else {
      NULLC::TraceLeaveTo(uVar2);
      if (ctx->memoryLimit != 0) {
        (*ctx->allocator->_vptr_Allocator[5])();
      }
      if (ctx->errorPos == (char *)0x0) {
        __assert_fail("ctx.errorPos != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x35a9,
                      "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                     );
      }
      pEVar9 = (ExprModule *)0x0;
    }
    ctx->moduleRoot = (char *)0x0;
    NULLC::TraceScope::~TraceScope(&traceScope);
    return pEVar9;
  }
  __assert_fail("!ctx.globalScope",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x3552,
                "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)")
  ;
}

Assistant:

ExprModule* Analyze(ExpressionContext &ctx, SynModule *syntax, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("analyze", "Analyze");

	assert(!ctx.globalScope);

	ctx.code = code;
	ctx.codeEnd = code + strlen(code);

	ctx.moduleRoot = moduleRoot;

	ctx.PushScope(SCOPE_EXPLICIT);
	ctx.globalScope = ctx.scope;

	ctx.AddType(ctx.typeVoid = new (ctx.get<TypeVoid>()) TypeVoid(InplaceStr("void")));

	ctx.AddType(ctx.typeBool = new (ctx.get<TypeBool>()) TypeBool(InplaceStr("bool")));

	ctx.AddType(ctx.typeChar = new (ctx.get<TypeChar>()) TypeChar(InplaceStr("char")));
	ctx.AddType(ctx.typeShort = new (ctx.get<TypeShort>()) TypeShort(InplaceStr("short")));
	ctx.AddType(ctx.typeInt = new (ctx.get<TypeInt>()) TypeInt(InplaceStr("int")));
	ctx.AddType(ctx.typeLong = new (ctx.get<TypeLong>()) TypeLong(InplaceStr("long")));

	ctx.AddType(ctx.typeFloat = new (ctx.get<TypeFloat>()) TypeFloat(InplaceStr("float")));
	ctx.AddType(ctx.typeDouble = new (ctx.get<TypeDouble>()) TypeDouble(InplaceStr("double")));

	ctx.AddType(ctx.typeTypeID = new (ctx.get<TypeTypeID>()) TypeTypeID(InplaceStr("typeid")));
	ctx.AddType(ctx.typeFunctionID = new (ctx.get<TypeFunctionID>()) TypeFunctionID(InplaceStr("__function")));
	ctx.AddType(ctx.typeNullPtr = new (ctx.get<TypeNullptr>()) TypeNullptr(InplaceStr("__nullptr")));

	ctx.AddType(ctx.typeGeneric = new (ctx.get<TypeGeneric>()) TypeGeneric(InplaceStr("generic")));

	ctx.AddType(ctx.typeAuto = new (ctx.get<TypeAuto>()) TypeAuto(InplaceStr("auto")));

	ctx.AddType(ctx.typeAutoRef = new (ctx.get<TypeAutoRef>()) TypeAutoRef(InplaceStr("auto ref")));
	ctx.PushScope(ctx.typeAutoRef);
	ctx.typeAutoRef->typeScope = ctx.scope;
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoRef);
	ctx.PopScope(SCOPE_TYPE);

	ctx.AddType(ctx.typeAutoArray = new (ctx.get<TypeAutoArray>()) TypeAutoArray(InplaceStr("auto[]")));
	ctx.PushScope(ctx.typeAutoArray);
	ctx.typeAutoArray->typeScope = ctx.scope;
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeInt, InplaceStr("size"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoArray);
	ctx.PopScope(SCOPE_TYPE);

	unsigned traceDepth = NULLC::TraceGetDepth();

	// Analyze module
	if(!setjmp(ctx.errorHandler))
	{
		ctx.errorHandlerActive = true;

		if(ctx.memoryLimit != 0)
		{
			unsigned totalLimit = ctx.allocator->requested() + ctx.memoryLimit;

			ctx.allocator->set_limit(totalLimit, &ctx, OnMemoryLimitHit);
		}

		ExprModule *module = AnalyzeModule(ctx, syntax);

		ctx.errorHandlerActive = false;

		if(ctx.memoryLimit != 0)
			ctx.allocator->clear_limit();

		ctx.statistics.Start(NULLCTime::clockMicro());

		assert(ctx.scope->type == SCOPE_EXPLICIT);
		ctx.scope = ctx.scope->scope;

		ctx.statistics.Finish("Cleanup", NULLCTime::clockMicro());

		assert(ctx.scope == NULL);

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	if(ctx.memoryLimit != 0)
		ctx.allocator->clear_limit();

	assert(ctx.errorPos != NULL);

	ctx.moduleRoot = NULL;

	return NULL;
}